

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptProxy::SetProperty
          (JavascriptProxy *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  ImplicitCallFlags *pIVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  bool bVar3;
  BOOL BVar4;
  HostScriptContext *pHVar5;
  PropertyDescriptor *this_01;
  undefined1 local_a0 [8];
  PropertyDescriptor resultDescriptor;
  PropertyDescriptor proxyPropertyDescriptor;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  proxyPropertyDescriptor._40_8_ = value;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&resultDescriptor.Configurable);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar5 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar5->scriptContext;
  pIVar1 = &this_00->implicitCallFlags;
  *pIVar1 = *pIVar1 | ImplicitCall_Accessor;
  BVar4 = JavascriptOperators::GetOwnPropertyDescriptor
                    ((RecyclableObject *)this,propertyId,pSVar2,
                     (PropertyDescriptor *)&resultDescriptor.Configurable);
  if (BVar4 == 0) {
    this_01 = (PropertyDescriptor *)local_a0;
    PropertyDescriptor::PropertyDescriptor(this_01);
    PropertyDescriptor::SetConfigurable(this_01,true);
    PropertyDescriptor::SetWritable(this_01,true);
    PropertyDescriptor::SetEnumerable(this_01,true);
    PropertyDescriptor::SetValue(this_01,(Var)proxyPropertyDescriptor._40_8_);
  }
  else {
    if (proxyPropertyDescriptor.originalVar.ptr._5_1_ != '\0' ||
        proxyPropertyDescriptor.originalVar.ptr._4_1_ != '\0') {
      return 0;
    }
    if (((char)proxyPropertyDescriptor.originalVar.ptr == '\x01') &&
       (bVar3 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&resultDescriptor.Configurable)
       , !bVar3)) {
      return 0;
    }
    this_01 = (PropertyDescriptor *)&resultDescriptor.Configurable;
    PropertyDescriptor::SetValue(this_01,(Var)proxyPropertyDescriptor._40_8_);
    Memory::Recycler::WBSetBit((char *)&proxyPropertyDescriptor.Setter);
    proxyPropertyDescriptor.Setter.ptr = (void *)0x0;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&proxyPropertyDescriptor.Setter);
  }
  BVar4 = JavascriptOperators::DefineOwnPropertyDescriptor
                    ((RecyclableObject *)this,propertyId,this_01,true,pSVar2,flags);
  return BVar4;
}

Assistant:

BOOL JavascriptProxy::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // This is the second half of [[set]] where when the handler does not specified [[set]] so we forward to [[set]] on target
        // with receiver as the proxy.
        //c.Let existingDescriptor be the result of calling the[[GetOwnProperty]] internal method of Receiver with argument P.
        //d.ReturnIfAbrupt(existingDescriptor).
        //e.If existingDescriptor is not undefined, then
        //    i.Let valueDesc be the PropertyDescriptor{ [[Value]]: V }.
        //    ii.Return the result of calling the[[DefineOwnProperty]] internal method of Receiver with arguments P and valueDesc.
        //f.Else Receiver does not currently have a property P,
        //    i.Return the result of performing CreateDataProperty(Receiver, P, V).
        // We can't cache the property at this time. both target and handler can be changed outside of the proxy, so the inline cache needs to be
        // invalidate when target, handler, or handler prototype has changed. We don't have a way to achieve this yet.
        PropertyValueInfo::SetNoCache(info, this);
        PropertyValueInfo::DisablePrototypeCache(info, this); // We can't cache prototype property either

        PropertyDescriptor proxyPropertyDescriptor;

        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        // Set implicit call flag so we bailout and not do copy-prop on field

        Js::ImplicitCallFlags saveImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->SetImplicitCallFlags((Js::ImplicitCallFlags)(saveImplicitCallFlags | ImplicitCall_Accessor));

        if (!JavascriptOperators::GetOwnPropertyDescriptor(this, propertyId, requestContext, &proxyPropertyDescriptor))
        {
            PropertyDescriptor resultDescriptor;
            resultDescriptor.SetConfigurable(true);
            resultDescriptor.SetWritable(true);
            resultDescriptor.SetEnumerable(true);
            resultDescriptor.SetValue(value);
            return Js::JavascriptOperators::DefineOwnPropertyDescriptor(this, propertyId, resultDescriptor, true, requestContext, flags);
        }
        else
        {
            // ES2017 Spec'd (9.1.9.1):
            // If existingDescriptor is not undefined, then
            //    If IsAccessorDescriptor(existingDescriptor) is true, return false.
            //    If existingDescriptor.[[Writable]] is false, return false.

            if (proxyPropertyDescriptor.IsAccessorDescriptor())
            {
                return FALSE;
            }

            if (proxyPropertyDescriptor.WritableSpecified() && !proxyPropertyDescriptor.IsWritable())
            {
                return FALSE;
            }

            proxyPropertyDescriptor.SetValue(value);
            proxyPropertyDescriptor.SetOriginal(nullptr);
            return Js::JavascriptOperators::DefineOwnPropertyDescriptor(this, propertyId, proxyPropertyDescriptor, true, requestContext, flags);
        }
    }